

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::swap(list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *this,list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *that)

{
  node_base *pnVar1;
  node_base *pnVar2;
  list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  temp;
  node_base local_18;
  
  local_18._next = &local_18;
  local_18._prev = &local_18;
  if ((that->_sentry)._next != &that->_sentry) {
    ((that->_sentry)._prev)->_next = &local_18;
    local_18._next = (that->_sentry)._next;
    (local_18._next)->_prev = &local_18;
    local_18._prev = (that->_sentry)._prev;
    (that->_sentry)._next = &that->_sentry;
    (that->_sentry)._prev = &that->_sentry;
  }
  if ((this->_sentry)._next != &this->_sentry) {
    pnVar1 = (that->_sentry)._next;
    ((this->_sentry)._prev)->_next = pnVar1;
    pnVar2 = (this->_sentry)._next;
    pnVar2->_prev = pnVar1->_prev;
    pnVar1->_prev->_next = pnVar2;
    pnVar1->_prev = (this->_sentry)._prev;
    (this->_sentry)._next = &this->_sentry;
    (this->_sentry)._prev = &this->_sentry;
  }
  if (local_18._next != &local_18) {
    pnVar1 = (this->_sentry)._next;
    (local_18._prev)->_next = pnVar1;
    (local_18._next)->_prev = pnVar1->_prev;
    pnVar1->_prev->_next = local_18._next;
    pnVar1->_prev = local_18._prev;
    local_18._prev = &local_18;
    local_18._next = &local_18;
  }
  while (local_18._next != &local_18) {
    pop_front((list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_18);
  }
  return;
}

Assistant:

void swap(list &that) // throw()
        {
            list temp;
            temp.splice(temp.begin(), that);  // move that to temp
            that.splice(that.begin(), *this); // move this to that
            splice(begin(), temp);            // move temp to this
        }